

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 EngineRelease(jx9 *pEngine)

{
  int iVar1;
  jx9_vm *pjVar2;
  sxi32 sVar3;
  jx9_vm *pBackend;
  
  if (0 < pEngine->iVm) {
    pBackend = pEngine->pVms;
    do {
      pjVar2 = pBackend->pNext;
      pBackend->nMagic = 0xdead2bad;
      SyMemBackendRelease(&pBackend->sAllocator);
      iVar1 = pEngine->iVm;
      pEngine->iVm = iVar1 + -1;
      pBackend = pjVar2;
    } while (1 < iVar1);
  }
  pEngine->nMagic = 0x7635;
  sVar3 = SyMemBackendRelease(&pEngine->sAllocator);
  return sVar3;
}

Assistant:

static sxi32 EngineRelease(jx9 *pEngine)
{
	jx9_vm *pVm, *pNext;
	/* Release all active VM */
	pVm = pEngine->pVms;
	for(;;){
		if( pEngine->iVm < 1 ){
			break;
		}
		pNext = pVm->pNext;
		jx9VmRelease(pVm);
		pVm = pNext;
		pEngine->iVm--;
	}
	/* Set a dummy magic number */
	pEngine->nMagic = 0x7635;
	/* Release the private memory subsystem */
	SyMemBackendRelease(&pEngine->sAllocator); 
	return JX9_OK;
}